

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::want_peers(torrent *this)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  session_settings *psVar3;
  torrent *this_local;
  
  iVar2 = num_peers(this);
  if (((((iVar2 < (int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                              >> 0x21) & 0xffffff)) && (bVar1 = is_paused(this), !bVar1)) &&
       ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0)) &&
      ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1f & 1) == 0)) &&
     ((((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
         != 1 && (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                         0x39) & 7) != 7)) || (bVar1 = valid_metadata(this), !bVar1)) &&
      (bVar1 = ::std::unique_ptr::operator_cast_to_bool
                         ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list), bVar1)))) {
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    iVar2 = peer_list::num_connect_candidates(this_00);
    if (iVar2 != 0) {
      psVar3 = settings(this);
      bVar1 = session_settings::get_bool(psVar3,0x802a);
      if ((!bVar1) &&
         ((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
           == 5 || (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >>
                           0x39) & 7) == 4)))) {
        return false;
      }
      psVar3 = settings(this);
      bVar1 = session_settings::get_bool(psVar3,0x8022);
      if (!bVar1) {
        psVar3 = settings(this);
        bVar1 = session_settings::get_bool(psVar3,0x8020);
        if (!bVar1) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool torrent::want_peers() const
	{
		// if all our connection slots are taken, we can't connect to more
		if (num_peers() >= int(m_max_connections)) return false;

		// if we're paused, obviously we're not connecting to peers
		if (is_paused() || m_abort || m_graceful_pause_mode) return false;

		if ((m_state == torrent_status::checking_files
			|| m_state == torrent_status::checking_resume_data)
			&& valid_metadata())
			return false;

		// if we don't know of any more potential peers to connect to, there's
		// no point in trying
		if (!m_peer_list || m_peer_list->num_connect_candidates() == 0)
			return false;

		// if the user disabled outgoing connections for seeding torrents,
		// don't make any
		if (!settings().get_bool(settings_pack::seeding_outgoing_connections)
			&& (m_state == torrent_status::seeding
				|| m_state == torrent_status::finished))
			return false;

		if (!settings().get_bool(settings_pack::enable_outgoing_tcp)
			&& !settings().get_bool(settings_pack::enable_outgoing_utp))
			return false;

		return true;
	}